

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crnlib.cpp
# Opt level: O1

void __thiscall crnlib::crn_block_compressor::crn_block_compressor(crn_block_compressor *this)

{
  pack_etc1_block_context *ppVar1;
  
  dxt_image::dxt_image(&this->m_image);
  (this->m_comp_params).m_size_of_obj = 0x378;
  (this->m_comp_params).m_file_type = cCRNFileTypeCRN;
  (this->m_comp_params).m_faces = 1;
  (this->m_comp_params).m_width = 0;
  (this->m_comp_params).m_height = 0;
  (this->m_comp_params).m_levels = 1;
  (this->m_comp_params).m_format = cCRNFmtDXT1;
  (this->m_comp_params).m_flags = 0xb;
  memset((this->m_comp_params).m_pImages,0,0x304);
  (this->m_comp_params).m_quality_level = 0xff;
  (this->m_comp_params).m_dxt1a_alpha_threshold = 0x80;
  (this->m_comp_params).m_dxt_quality = cCRNDXTQualityUber;
  (this->m_comp_params).m_dxt_compressor_type = cCRNDXTCompressorCRN;
  (this->m_comp_params).m_alpha_component = 3;
  (this->m_comp_params).m_crn_adaptive_tile_color_psnr_derating = 2.0;
  (this->m_comp_params).m_crn_adaptive_tile_alpha_psnr_derating = 2.0;
  (this->m_comp_params).m_crn_color_endpoint_palette_size = 0;
  (this->m_comp_params).m_crn_color_selector_palette_size = 0;
  (this->m_comp_params).m_crn_alpha_endpoint_palette_size = 0;
  (this->m_comp_params).m_crn_alpha_selector_palette_size = 0;
  (this->m_comp_params).m_num_helper_threads = 0;
  (this->m_comp_params).m_userdata0 = 1;
  (this->m_comp_params).m_userdata1 = 0;
  (this->m_comp_params).m_pProgress_func = (crn_progress_callback_func)0x0;
  (this->m_comp_params).m_pProgress_func_data = (void *)0x0;
  (this->m_pack_params).m_quality = cCRNDXTQualityUber;
  (this->m_pack_params).m_compressor = cCRNDXTCompressorCRN;
  (this->m_pack_params).m_perceptual = true;
  (this->m_pack_params).m_dithering = false;
  (this->m_pack_params).m_grayscale_sampling = false;
  (this->m_pack_params).m_use_both_block_types = true;
  (this->m_pack_params).m_endpoint_caching = true;
  (this->m_pack_params).m_use_transparent_indices_for_black = false;
  (this->m_pack_params).m_pProgress_callback = (progress_callback_func)0x0;
  (this->m_pack_params).m_pProgress_callback_user_data_ptr = (void *)0x0;
  (this->m_pack_params).m_dxt1a_alpha_threshold = 0x80;
  (this->m_pack_params).m_num_helper_threads = 0;
  (this->m_pack_params).m_progress_start = 0;
  (this->m_pack_params).m_progress_range = 100;
  (this->m_pack_params).m_pTask_pool = (task_pool *)0x0;
  dxt1_endpoint_optimizer::dxt1_endpoint_optimizer
            (&(this->m_set_block_pixels_context).m_dxt1_optimizer);
  dxt5_endpoint_optimizer::dxt5_endpoint_optimizer
            (&(this->m_set_block_pixels_context).m_dxt5_optimizer);
  (this->m_set_block_pixels_context).m_etc1_optimizer.m_optimizer.m_sorted_luma[1].m_p = (uint *)0x0
  ;
  ppVar1 = &(this->m_set_block_pixels_context).m_etc1_optimizer;
  (ppVar1->m_optimizer).m_sorted_luma[1].m_size = 0;
  (ppVar1->m_optimizer).m_sorted_luma[1].m_capacity = 0;
  (this->m_set_block_pixels_context).m_etc1_optimizer.m_optimizer.m_sorted_luma[0].m_p = (uint *)0x0
  ;
  (this->m_set_block_pixels_context).m_etc1_optimizer.m_optimizer.m_sorted_luma[0].m_size = 0;
  (this->m_set_block_pixels_context).m_etc1_optimizer.m_optimizer.m_sorted_luma[0].m_capacity = 0;
  (this->m_set_block_pixels_context).m_etc1_optimizer.m_optimizer.m_luma.m_p = (unsigned_short *)0x0
  ;
  (this->m_set_block_pixels_context).m_etc1_optimizer.m_optimizer.m_luma.m_size = 0;
  (this->m_set_block_pixels_context).m_etc1_optimizer.m_optimizer.m_luma.m_capacity = 0;
  (this->m_set_block_pixels_context).m_etc1_optimizer.m_optimizer.m_best_solution.m_selectors.m_p =
       (uchar *)0x0;
  ppVar1 = &(this->m_set_block_pixels_context).m_etc1_optimizer;
  (ppVar1->m_optimizer).m_best_solution.m_selectors.m_size = 0;
  (ppVar1->m_optimizer).m_best_solution.m_selectors.m_capacity = 0;
  (this->m_set_block_pixels_context).m_etc1_optimizer.m_optimizer.m_selectors.m_p = (uchar *)0x0;
  (this->m_set_block_pixels_context).m_etc1_optimizer.m_optimizer.m_selectors.m_size = 0;
  (this->m_set_block_pixels_context).m_etc1_optimizer.m_optimizer.m_selectors.m_capacity = 0;
  (this->m_set_block_pixels_context).m_etc1_optimizer.m_optimizer.m_best_selectors.m_p =
       (uchar *)0x0;
  (this->m_set_block_pixels_context).m_etc1_optimizer.m_optimizer.m_best_selectors.m_size = 0;
  (this->m_set_block_pixels_context).m_etc1_optimizer.m_optimizer.m_best_selectors.m_capacity = 0;
  *(undefined8 *)
   ((long)&(this->m_set_block_pixels_context).m_etc1_optimizer.m_optimizer.m_best_selectors.m_size +
   1) = 0;
  *(undefined8 *)
   ((long)&(this->m_set_block_pixels_context).m_etc1_optimizer.m_optimizer.m_best_solution.m_coords.
           m_unscaled_color.field_0 + 1) = 0;
  (this->m_set_block_pixels_context).m_etc1_optimizer.m_optimizer.m_best_solution.m_error =
       0xffffffffffffffff;
  (this->m_set_block_pixels_context).m_etc1_optimizer.m_optimizer.m_best_solution.m_valid = false;
  (this->m_set_block_pixels_context).m_etc1_optimizer.m_optimizer.m_trial_solution.m_coords.m_color4
       = false;
  ppVar1 = &(this->m_set_block_pixels_context).m_etc1_optimizer;
  (ppVar1->m_optimizer).m_trial_solution.m_coords.m_unscaled_color =
       (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)0x0;
  (ppVar1->m_optimizer).m_trial_solution.m_coords.m_inten_table = 0;
  (this->m_set_block_pixels_context).m_etc1_optimizer.m_optimizer.m_trial_solution.m_selectors.m_p =
       (uchar *)0x0;
  ppVar1 = &(this->m_set_block_pixels_context).m_etc1_optimizer;
  (ppVar1->m_optimizer).m_trial_solution.m_selectors.m_size = 0;
  (ppVar1->m_optimizer).m_trial_solution.m_selectors.m_capacity = 0;
  (this->m_set_block_pixels_context).m_etc1_optimizer.m_optimizer.m_trial_solution.m_error =
       0xffffffffffffffff;
  (this->m_set_block_pixels_context).m_etc1_optimizer.m_optimizer.m_trial_solution.m_valid = false;
  (this->m_set_block_pixels_context).m_etc1_optimizer.m_optimizer.m_temp_selectors.m_p =
       (uchar *)0x0;
  (this->m_set_block_pixels_context).m_etc1_optimizer.m_optimizer.m_temp_selectors.m_size = 0;
  (this->m_set_block_pixels_context).m_etc1_optimizer.m_optimizer.m_temp_selectors.m_capacity = 0;
  (this->m_set_block_pixels_context).m_etc1_optimizer.m_optimizer.m_pParams = (params *)0x0;
  (this->m_set_block_pixels_context).m_etc1_optimizer.m_optimizer.m_pResult = (results *)0x0;
  (this->m_set_block_pixels_context).m_etc1_optimizer.m_optimizer.m_pSorted_luma_indices =
       (uint32 *)0x0;
  (this->m_set_block_pixels_context).m_etc1_optimizer.m_optimizer.m_pSorted_luma = (uint32 *)0x0;
  return;
}

Assistant:

crn_block_compressor() {
  }